

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::EnumOptions::Clear(EnumOptions *this)

{
  internal::ExtensionSet::Clear(&this->_extensions_);
  if ((char)this->_has_bits_[0] != '\0') {
    this->allow_alias_ = true;
  }
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
  this->_has_bits_[0] = 0;
  UnknownFieldSet::Clear(&this->_unknown_fields_);
  return;
}

Assistant:

void EnumOptions::Clear() {
  _extensions_.Clear();
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    allow_alias_ = true;
  }
  uninterpreted_option_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}